

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDEdge * __thiscall
ON_SubDimple::AddEdge
          (ON_SubDimple *this,uint candidate_edge_id,ON_SubDEdgeTag edge_tag,ON_SubDVertex *v0,
          double v0_sector_coefficient,ON_SubDVertex *v1,double v1_sector_coefficient,
          uint initial_face_capacity)

{
  ushort uVar1;
  ON_SubDVertex *v_00;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ON_SubDEdgePtr OVar5;
  ON_SubDEdge *pOVar6;
  ON_SubDVertex *local_a8;
  double vertex_coefficient;
  ON_SubDVertex *v;
  uint i;
  ON_SubDEdge *e;
  bool bEdgeTagSet;
  ON_SubDVertex *pOStack_40;
  uint initial_face_capacity_local;
  double v1_sector_coefficient_local;
  ON_SubDVertex *v1_local;
  double v0_sector_coefficient_local;
  ON_SubDVertex *v0_local;
  ON_SubDEdgeTag edge_tag_local;
  uint candidate_edge_id_local;
  ON_SubDimple *this_local;
  
  bVar2 = ON_SubDSectorType::IsValidSectorCoefficientValue(v0_sector_coefficient,true);
  if (bVar2) {
    bVar2 = ON_SubDSectorType::IsValidSectorCoefficientValue(v1_sector_coefficient,true);
    if (bVar2) {
      if ((v0 != (ON_SubDVertex *)0x0) && (v1 != (ON_SubDVertex *)0x0)) {
        uVar3 = ON_SubDComponentBase::SubdivisionLevel(&v0->super_ON_SubDComponentBase);
        uVar4 = ON_SubDComponentBase::SubdivisionLevel(&v1->super_ON_SubDComponentBase);
        if (uVar3 != uVar4) {
          ON_SubDIncrementErrorCount();
          return (ON_SubDEdge *)0x0;
        }
      }
      bVar2 = ON_SubD::EdgeTagIsSet(edge_tag);
      v1_local = (ON_SubDVertex *)v0_sector_coefficient;
      if ((((bVar2) && ((v0_sector_coefficient != 0.0 || (NAN(v0_sector_coefficient))))) &&
          ((v0_sector_coefficient != -8883.0 || (NAN(v0_sector_coefficient))))) &&
         ((v0 != (ON_SubDVertex *)0x0 && (v0->m_vertex_tag == Smooth)))) {
        v1_local = (ON_SubDVertex *)0.0;
      }
      pOStack_40 = (ON_SubDVertex *)v1_sector_coefficient;
      if (((bVar2) && ((v1_sector_coefficient != 0.0 || (NAN(v1_sector_coefficient))))) &&
         (((v1_sector_coefficient != -8883.0 || (NAN(v1_sector_coefficient))) &&
          ((v1 != (ON_SubDVertex *)0x0 && (v1->m_vertex_tag == Smooth)))))) {
        pOStack_40 = (ON_SubDVertex *)0.0;
      }
      this_local = (ON_SubDimple *)AllocateEdge(this,candidate_edge_id,edge_tag,0,0);
      if (this_local == (ON_SubDimple *)0x0) {
        ON_SubDIncrementErrorCount();
        this_local = (ON_SubDimple *)0x0;
      }
      else {
        if (v0 == (ON_SubDVertex *)0x0) {
          if (v1 == (ON_SubDVertex *)0x0) {
            uVar3 = ActiveLevelIndex(this);
            if (uVar3 != 0xffffffff) {
              uVar3 = ActiveLevelIndex(this);
              ON_SubDComponentBase::SetSubdivisionLevel((ON_SubDComponentBase *)this_local,uVar3);
            }
          }
          else {
            uVar3 = ON_SubDComponentBase::SubdivisionLevel(&v1->super_ON_SubDComponentBase);
            ON_SubDComponentBase::SetSubdivisionLevel((ON_SubDComponentBase *)this_local,uVar3);
          }
        }
        else {
          uVar3 = ON_SubDComponentBase::SubdivisionLevel(&v0->super_ON_SubDComponentBase);
          ON_SubDComponentBase::SetSubdivisionLevel((ON_SubDComponentBase *)this_local,uVar3);
        }
        for (v._4_4_ = 0; v._4_4_ < 2; v._4_4_ = v._4_4_ + 1) {
          if (v._4_4_ == 0) {
            local_a8 = v1_local;
            v_00 = v0;
          }
          else {
            local_a8 = pOStack_40;
            v_00 = v1;
          }
          *(ON_SubDVertex **)
           ((this_local->m_subd_toplology_and_edge_creases_hash).m_vertex_hash.m_digest +
           (ulong)v._4_4_ * 8 + -0x18) = v_00;
          *(ON_SubDVertex **)
           ((this_local->m_subd_toplology_and_edge_creases_hash).m_vertex_hash.m_digest +
           (ulong)v._4_4_ * 8 + -8) = local_a8;
          if (v_00 != (ON_SubDVertex *)0x0) {
            bVar2 = ON_SubDHeap::GrowVertexEdgeArrayByOne(&this->m_heap,v_00);
            if (!bVar2) {
              ON_ComponentStatus::SetDamagedState(&(v_00->super_ON_SubDComponentBase).m_status,true)
              ;
              ReturnEdge(this,(ON_SubDEdge *)this_local);
              ON_SubDIncrementErrorCount();
              return (ON_SubDEdge *)0x0;
            }
            OVar5 = ON_SubDEdgePtr::Create((ON_SubDEdge *)this_local,(ulong)v._4_4_);
            uVar1 = v_00->m_edge_count;
            v_00->m_edge_count = uVar1 + 1;
            v_00->m_edges[uVar1].m_ptr = OVar5.m_ptr;
          }
        }
        pOVar6 = AddEdgeToLevel(this,(ON_SubDEdge *)this_local);
        if (pOVar6 == (ON_SubDEdge *)0x0) {
          ON_SubDIncrementErrorCount();
          this_local = (ON_SubDimple *)0x0;
        }
        else if (2 < initial_face_capacity) {
          ON_SubDHeap::GrowEdgeFaceArray
                    (&this->m_heap,(ON_SubDEdge *)this_local,(ulong)initial_face_capacity);
        }
      }
    }
    else {
      ON_SubDIncrementErrorCount();
      this_local = (ON_SubDimple *)0x0;
    }
  }
  else {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubDimple *)0x0;
  }
  return (ON_SubDEdge *)this_local;
}

Assistant:

class ON_SubDEdge* ON_SubDimple::AddEdge(
  unsigned int candidate_edge_id,
  ON_SubDEdgeTag edge_tag,
  ON_SubDVertex* v0,
  double v0_sector_coefficient,
  ON_SubDVertex* v1,
  double v1_sector_coefficient,
  unsigned initial_face_capacity
)
{
  if (false == ON_SubDSectorType::IsValidSectorCoefficientValue(v0_sector_coefficient, true))
    return ON_SUBD_RETURN_ERROR(nullptr);

  if (false == ON_SubDSectorType::IsValidSectorCoefficientValue(v1_sector_coefficient, true))
    return ON_SUBD_RETURN_ERROR(nullptr);

  if (nullptr != v0 && nullptr != v1 && v0->SubdivisionLevel() != v1->SubdivisionLevel())
    return ON_SUBD_RETURN_ERROR(nullptr);

  const bool bEdgeTagSet = ON_SubD::EdgeTagIsSet(edge_tag);

  if (bEdgeTagSet
    && ON_SubDSectorType::IgnoredSectorCoefficient != v0_sector_coefficient
    && ON_SubDSectorType::UnsetSectorCoefficient != v0_sector_coefficient
    && nullptr != v0
    && ON_SubDVertexTag::Smooth == v0->m_vertex_tag
    )
  {
    // minimizes checking when building subds because constant crease coefficients can be passed in
    v0_sector_coefficient = ON_SubDSectorType::IgnoredSectorCoefficient;
  }

  if (bEdgeTagSet
    && ON_SubDSectorType::IgnoredSectorCoefficient != v1_sector_coefficient
    && ON_SubDSectorType::UnsetSectorCoefficient != v1_sector_coefficient
    && nullptr != v1
    && ON_SubDVertexTag::Smooth == v1->m_vertex_tag
    )
  {
    // minimizes checking when building subds because constant crease coefficients can be passed in
    v1_sector_coefficient = ON_SubDSectorType::IgnoredSectorCoefficient;
  }

  class ON_SubDEdge* e = AllocateEdge(candidate_edge_id, edge_tag, 0, 0);
  if (nullptr == e)
    return ON_SUBD_RETURN_ERROR(nullptr);

  if (nullptr != v0)
    e->SetSubdivisionLevel(v0->SubdivisionLevel());
  else if (nullptr != v1)
    e->SetSubdivisionLevel(v1->SubdivisionLevel());
  else if (ActiveLevelIndex() < ON_UNSET_UINT_INDEX)
    e->SetSubdivisionLevel(ActiveLevelIndex());

  for (unsigned int i = 0; i < 2; i++)
  {
    ON_SubDVertex* v = (i ? v1 : v0);
    double vertex_coefficient = (i ? v1_sector_coefficient : v0_sector_coefficient);
    e->m_vertex[i] = v;
    e->m_sector_coefficient[i] = vertex_coefficient;
    if (nullptr != v)
    {
      if (false == m_heap.GrowVertexEdgeArrayByOne(v))
      {
        v->m_status.SetDamagedState(true);
        ReturnEdge(e);
        return ON_SUBD_RETURN_ERROR(nullptr);
      }
      v->m_edges[v->m_edge_count++] = ON_SubDEdgePtr::Create(e, i);
    }
  }

  if ( nullptr == AddEdgeToLevel(e) )
    return ON_SUBD_RETURN_ERROR(nullptr);

  if (initial_face_capacity > 2)
  {
    m_heap.GrowEdgeFaceArray(e, initial_face_capacity);
  }

  return e;
}